

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_stat(uv_loop_t *loop,uv_fs_t *req,char *path,uv_fs_cb cb)

{
  char *pcVar1;
  uv_fs_cb cb_local;
  char *path_local;
  uv_fs_t *req_local;
  uv_loop_t *loop_local;
  
  if (req == (uv_fs_t *)0x0) {
    loop_local._4_4_ = -0x16;
  }
  else {
    req->type = UV_FS;
    req->fs_type = UV_FS_STAT;
    req->result = 0;
    req->ptr = (void *)0x0;
    req->loop = loop;
    req->path = (char *)0x0;
    req->new_path = (char *)0x0;
    req->bufs = (uv_buf_t *)0x0;
    req->cb = cb;
    if (path == (char *)0x0) {
      __assert_fail("path != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/fs.c"
                    ,0x77c,"int uv_fs_stat(uv_loop_t *, uv_fs_t *, const char *, uv_fs_cb)");
    }
    if (cb == (uv_fs_cb)0x0) {
      req->path = path;
    }
    else {
      pcVar1 = uv__strdup(path);
      req->path = pcVar1;
      if (req->path == (char *)0x0) {
        return -0xc;
      }
    }
    if (cb == (uv_fs_cb)0x0) {
      uv__fs_work(&req->work_req);
      loop_local._4_4_ = (int)req->result;
    }
    else {
      (loop->active_reqs).count = (loop->active_reqs).count + 1;
      uv__work_submit(loop,&req->work_req,UV__WORK_FAST_IO,uv__fs_work,uv__fs_done);
      loop_local._4_4_ = 0;
    }
  }
  return loop_local._4_4_;
}

Assistant:

int uv_fs_stat(uv_loop_t* loop, uv_fs_t* req, const char* path, uv_fs_cb cb) {
  INIT(STAT);
  PATH;
  POST;
}